

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_error_alert *this)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  allocator<char> local_2c5 [13];
  string local_2b8;
  string local_298;
  char local_278 [8];
  char msg [600];
  dht_error_alert *this_local;
  
  pcVar2 = operation_name(this->op);
  uVar1 = boost::system::error_code::value(&this->error);
  boost::system::error_code::message_abi_cxx11_(&local_2b8,&this->error);
  convert_from_native(&local_298,&local_2b8);
  uVar3 = std::__cxx11::string::c_str();
  snprintf(local_278,600,"DHT error [%s] (%d) %s",pcVar2,(ulong)uVar1,uVar3);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,local_2c5);
  std::allocator<char>::~allocator(local_2c5);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_error_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "DHT error [%s] (%d) %s"
			, operation_name(op)
			, error.value()
			, convert_from_native(error.message()).c_str());
		return msg;
	}